

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::TriangleIntersection> *
pbrt::IntersectTriangle(Ray *ray,Float tMax,Point3f *p0,Point3f *p1,Point3f *p2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  initializer_list<int> v;
  initializer_list<int> v_00;
  initializer_list<int> v_01;
  initializer_list<int> v_02;
  array<int,_3> p;
  array<int,_3> p_00;
  array<int,_3> p_01;
  array<int,_3> p_02;
  array<int,_3> *this;
  int in_ECX;
  iterator in_RDX;
  long in_RSI;
  int __x;
  optional<pbrt::TriangleIntersection> *in_RDI;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  Vector3<float> VVar26;
  Point3<float> PVar27;
  Float deltaT;
  Float maxE;
  Float deltaE;
  Float deltaY;
  Float deltaX;
  Float maxYt;
  Float maxXt;
  Float deltaZ;
  Float maxZt;
  Float t;
  Float b2;
  Float b1;
  Float b0;
  Float invDet;
  Float tScaled;
  Float det;
  double p1typ0tx;
  double p1txp0ty;
  double p0typ2tx;
  double p0txp2ty;
  double p2typ1tx;
  double p2txp1ty;
  Float e2;
  Float e1;
  Float e0;
  Float Sz;
  Float Sy;
  Float Sx;
  Vector3f d;
  int ky;
  int kx;
  int kz;
  Point3f p2t;
  Point3f p1t;
  Point3f p0t;
  float in_stack_fffffffffffffb78;
  float in_stack_fffffffffffffb7c;
  Vector3<float> *in_stack_fffffffffffffb80;
  optional<pbrt::TriangleIntersection> *this_00;
  Point3<float> *in_stack_fffffffffffffb88;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffb90;
  Tuple3<pbrt::Vector3,_float> *t_00;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined1 *puVar28;
  Tuple3<pbrt::Vector3,_float> local_3a4;
  undefined8 local_398;
  float local_390;
  float local_38c;
  undefined8 local_388;
  float local_380;
  undefined8 local_368;
  float local_360;
  float local_358;
  float local_354;
  undefined8 local_350;
  float local_348;
  optional<pbrt::TriangleIntersection> local_33c;
  float local_328;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  int *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_26c;
  float local_264;
  undefined8 local_260;
  float local_258;
  undefined8 local_250;
  undefined4 local_248;
  int local_23c;
  int local_238;
  int local_234;
  int *local_230;
  undefined8 local_228;
  undefined8 local_21c;
  undefined4 local_214;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1bc;
  undefined4 local_1b4;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  undefined4 local_188;
  int local_17c;
  int local_178;
  int local_174;
  int *local_170;
  undefined8 local_168;
  undefined8 local_15c;
  undefined4 local_154;
  undefined8 local_150;
  float local_148;
  int local_140;
  int local_13c;
  Tuple3<pbrt::Vector3,_float> local_138;
  Tuple3<pbrt::Vector3,_float> local_128;
  int local_11c;
  undefined8 local_118;
  float local_110;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined1 local_a4 [12];
  undefined8 local_98;
  float local_90;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Tuple3<pbrt::Vector3,_float> local_3c;
  int local_28;
  iterator local_20;
  float local_14;
  long local_10;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  auVar25 = in_ZMM0._8_56_;
  local_14 = in_ZMM0._0_4_;
  local_20 = in_RDX;
  local_10 = in_RSI;
  local_28 = in_ECX;
  VVar26 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  local_50 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar25;
  local_58 = vmovlpd_avx(auVar7._0_16_);
  local_48 = local_58;
  local_40 = local_50;
  VVar26 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  local_70 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar25;
  local_78 = vmovlpd_avx(auVar8._0_16_);
  local_68 = local_78;
  local_60 = local_70;
  VVar26 = Cross<float>((Vector3<float> *)in_stack_fffffffffffffb90,
                        (Vector3<float> *)in_stack_fffffffffffffb88);
  local_88.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar25;
  local_88._0_8_ = vmovlpd_avx(auVar9._0_16_);
  local_3c._0_8_ = local_88._0_8_;
  local_3c.z = local_88.z;
  fVar4 = LengthSquared<float>((Vector3<float> *)&local_3c);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    puVar28 = local_a4;
    auVar25 = extraout_var_02;
    Vector3<float>::Vector3<float>
              (in_stack_fffffffffffffb80,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    PVar27 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb90,
                        (Vector3<float> *)in_stack_fffffffffffffb88);
    local_b0 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar25;
    local_b8 = vmovlpd_avx(auVar10._0_16_);
    local_98 = local_b8;
    local_90 = local_b0;
    Vector3<float>::Vector3<float>
              (in_stack_fffffffffffffb80,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    PVar27 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb90,
                        (Vector3<float> *)in_stack_fffffffffffffb88);
    local_e0 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar11._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar25;
    local_e8 = vmovlpd_avx(auVar11._0_16_);
    local_c8 = local_e8;
    local_c0 = local_e0;
    Vector3<float>::Vector3<float>
              (in_stack_fffffffffffffb80,
               (Point3<float> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    PVar27 = Point3<float>::operator-
                       ((Point3<float> *)in_stack_fffffffffffffb90,
                        (Vector3<float> *)in_stack_fffffffffffffb88);
    local_110 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar25;
    local_118 = vmovlpd_avx(auVar12._0_16_);
    local_f8 = local_118;
    local_f0 = local_110;
    VVar26 = Abs<pbrt::Vector3,float>(in_stack_fffffffffffffb90);
    local_138.z = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar25;
    local_138._0_8_ = vmovlpd_avx(auVar13._0_16_);
    local_128._0_8_ = local_138._0_8_;
    local_128.z = local_138.z;
    local_174 = MaxComponentIndex<pbrt::Vector3,float>(&local_128);
    local_13c = local_174 + 1;
    if (local_13c == 3) {
      local_13c = 0;
    }
    local_140 = local_13c + 1;
    if (local_140 == 3) {
      local_140 = 0;
    }
    this = (array<int,_3> *)(local_10 + 0xc);
    local_17c = local_13c;
    local_178 = local_140;
    local_170 = &local_17c;
    local_168 = 3;
    v._M_len = (size_type)puVar28;
    v._M_array = local_20;
    local_11c = local_174;
    pstd::array<int,_3>::array(this,v);
    local_188 = local_154;
    local_190 = local_15c;
    p.values[2] = local_28;
    p.values._0_8_ = puVar28;
    VVar26 = Permute<pbrt::Vector3,float>
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),p);
    local_198 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar25;
    local_1a0 = vmovlpd_avx(auVar14._0_16_);
    local_1dc = local_13c;
    local_1d8 = local_140;
    local_1d4 = local_11c;
    local_1d0 = &local_1dc;
    local_1c8 = 3;
    v_00._M_len = (size_type)puVar28;
    v_00._M_array = local_20;
    local_150 = local_1a0;
    local_148 = local_198;
    pstd::array<int,_3>::array(this,v_00);
    local_1e8 = local_1b4;
    local_1f0 = local_1bc;
    p_00.values[2] = local_28;
    p_00.values._0_8_ = puVar28;
    PVar27 = Permute<pbrt::Point3,float>
                       ((Tuple3<pbrt::Point3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),p_00);
    local_1f8 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar15._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar15._8_56_ = auVar25;
    local_200 = vmovlpd_avx(auVar15._0_16_);
    local_23c = local_13c;
    local_238 = local_140;
    local_234 = local_11c;
    local_230 = &local_23c;
    local_228 = 3;
    v_01._M_len = (size_type)puVar28;
    v_01._M_array = local_20;
    local_1b0 = local_200;
    local_1a8 = local_1f8;
    local_98 = local_200;
    local_90 = local_1f8;
    pstd::array<int,_3>::array(this,v_01);
    local_248 = local_214;
    local_250 = local_21c;
    p_01.values[2] = local_28;
    p_01.values._0_8_ = puVar28;
    PVar27 = Permute<pbrt::Point3,float>
                       ((Tuple3<pbrt::Point3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),p_01);
    local_258 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar16._8_56_ = auVar25;
    local_260 = vmovlpd_avx(auVar16._0_16_);
    local_294 = local_13c;
    local_290 = local_140;
    local_28c = local_11c;
    local_288 = &local_294;
    local_280 = 3;
    v_02._M_len = (size_type)puVar28;
    v_02._M_array = local_20;
    local_210 = local_260;
    local_208 = local_258;
    local_c8 = local_260;
    local_c0 = local_258;
    pstd::array<int,_3>::array(this,v_02);
    local_2a0 = local_270;
    local_2a8 = local_278;
    p_02.values[2] = local_28;
    p_02.values._0_8_ = puVar28;
    PVar27 = Permute<pbrt::Point3,float>
                       ((Tuple3<pbrt::Point3,_float> *)
                        CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),p_02);
    local_2b0 = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar17._8_56_ = auVar25;
    local_2b8 = vmovlpd_avx(auVar17._0_16_);
    local_2bc = -(float)local_150 / local_148;
    local_2c0 = -local_150._4_4_ / local_148;
    local_2c4 = 1.0 / local_148;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_90),ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(float)local_98));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_90),ZEXT416((uint)local_2c0),
                             ZEXT416((uint)local_98._4_4_));
    local_98._4_4_ = auVar2._0_4_;
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_c0),ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(float)local_c8));
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_c0),ZEXT416((uint)local_2c0),
                             ZEXT416((uint)local_c8._4_4_));
    local_c8._4_4_ = auVar3._0_4_;
    local_f8._0_4_ = (float)local_2b8;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_2b0),ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(float)local_f8));
    local_f8._0_4_ = auVar3._0_4_;
    local_f8._4_4_ = (float)((ulong)local_2b8 >> 0x20);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_2b0),ZEXT416((uint)local_2c0),
                             ZEXT416((uint)local_f8._4_4_));
    local_f8._4_4_ = auVar3._0_4_;
    local_26c = local_2b8;
    local_264 = local_2b0;
    local_f0 = local_2b0;
    local_c8._0_4_ = auVar2._0_4_;
    local_98._0_4_ = auVar1._0_4_;
    local_2c8 = DifferenceOfProducts<float,float,float,float>
                          ((float)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                           SUB84(in_stack_fffffffffffffb90,0),
                           (float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                           SUB84(in_stack_fffffffffffffb88,0));
    local_2cc = DifferenceOfProducts<float,float,float,float>
                          ((float)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                           SUB84(in_stack_fffffffffffffb90,0),
                           (float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                           SUB84(in_stack_fffffffffffffb88,0));
    local_2d0 = DifferenceOfProducts<float,float,float,float>
                          ((float)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                           SUB84(in_stack_fffffffffffffb90,0),
                           (float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                           SUB84(in_stack_fffffffffffffb88,0));
    if ((((local_2c8 == 0.0) && (!NAN(local_2c8))) || ((local_2cc == 0.0 && (!NAN(local_2cc))))) ||
       ((local_2d0 == 0.0 && (!NAN(local_2d0))))) {
      local_2d8 = (double)(float)local_f8 * (double)local_c8._4_4_;
      local_2e0 = (double)local_f8._4_4_ * (double)(float)local_c8;
      local_2c8 = (float)(local_2e0 - local_2d8);
      local_2e8 = (double)(float)local_98 * (double)local_f8._4_4_;
      local_2f0 = (double)local_98._4_4_ * (double)(float)local_f8;
      local_2cc = (float)(local_2f0 - local_2e8);
      local_2f8 = (double)(float)local_c8 * (double)local_98._4_4_;
      local_300 = (double)local_c8._4_4_ * (double)(float)local_98;
      local_2d0 = (float)(local_300 - local_2f8);
    }
    if ((((0.0 <= local_2c8) && (0.0 <= local_2cc)) && (0.0 <= local_2d0)) ||
       (((local_2c8 <= 0.0 && (local_2cc <= 0.0)) && (local_2d0 <= 0.0)))) {
      local_304 = local_2c8 + local_2cc + local_2d0;
      if ((local_304 != 0.0) || (NAN(local_304))) {
        local_90 = local_2c4 * local_90;
        local_c0 = local_2c4 * local_c0;
        local_f0 = local_2c4 * local_f0;
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_90),ZEXT416((uint)local_2c8),
                                 ZEXT416((uint)(local_2cc * local_c0)));
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_f0),ZEXT416((uint)local_2d0),auVar1);
        local_308 = auVar1._0_4_;
        if ((0.0 <= local_304) || ((local_308 < 0.0 && (local_14 * local_304 <= local_308)))) {
          if ((local_304 <= 0.0) || ((0.0 < local_308 && (local_308 <= local_14 * local_304)))) {
            local_30c = 1.0 / local_304;
            local_310 = local_2c8 * local_30c;
            local_314 = local_2cc * local_30c;
            local_318 = local_2d0 * local_30c;
            local_31c = local_308 * local_30c;
            auVar25 = (undefined1  [56])0x0;
            this_00 = &local_33c;
            Vector3<float>::Vector3
                      ((Vector3<float> *)this_00,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78
                       ,0.0);
            VVar26 = Abs<pbrt::Vector3,float>(in_stack_fffffffffffffb90);
            local_348 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar18._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar18._8_56_ = auVar25;
            local_350 = vmovlpd_avx(auVar18._0_16_);
            local_33c._12_8_ = local_350;
            local_328 = local_348;
            auVar19._0_4_ = MaxComponentValue<pbrt::Vector3,float>(in_stack_fffffffffffffb90);
            auVar19._4_60_ = extraout_var;
            local_320 = auVar19._0_4_;
            dVar6 = gamma(auVar19._0_8_);
            local_354 = SUB84(dVar6,0) * local_320;
            auVar25 = (undefined1  [56])0x0;
            Vector3<float>::Vector3
                      ((Vector3<float> *)this_00,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78
                       ,0.0);
            VVar26 = Abs<pbrt::Vector3,float>(in_stack_fffffffffffffb90);
            local_380 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar20._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar20._8_56_ = auVar25;
            local_388 = vmovlpd_avx(auVar20._0_16_);
            local_368 = local_388;
            local_360 = local_380;
            local_358 = MaxComponentValue<pbrt::Vector3,float>(in_stack_fffffffffffffb90);
            auVar25 = (undefined1  [56])0x0;
            t_00 = &local_3a4;
            Vector3<float>::Vector3
                      ((Vector3<float> *)this_00,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78
                       ,0.0);
            VVar26 = Abs<pbrt::Vector3,float>(t_00);
            local_390 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar21._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar21._8_56_ = auVar25;
            local_398 = vmovlpd_avx(auVar21._0_16_);
            auVar22._0_4_ = MaxComponentValue<pbrt::Vector3,float>(t_00);
            auVar22._4_60_ = extraout_var_00;
            local_38c = auVar22._0_4_;
            dVar6 = gamma(auVar22._0_8_);
            fVar4 = SUB84(dVar6,0) * (local_358 + local_320);
            dVar6 = gamma((double)(ulong)(uint)fVar4);
            fVar5 = SUB84(dVar6,0) * (local_38c + local_320);
            dVar6 = gamma((double)(ulong)(uint)fVar5);
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38c),
                                     ZEXT416((uint)(SUB84(dVar6,0) * local_358)),
                                     ZEXT416((uint)(fVar5 * local_358)));
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38c),ZEXT416((uint)fVar4),auVar1);
            auVar25 = (undefined1  [56])0x0;
            Vector3<float>::Vector3
                      ((Vector3<float> *)this_00,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78
                       ,0.0);
            VVar26 = Abs<pbrt::Vector3,float>(t_00);
            auVar23._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar23._8_56_ = auVar25;
            vmovlpd_avx(auVar23._0_16_);
            auVar24._0_4_ = MaxComponentValue<pbrt::Vector3,float>(t_00);
            auVar24._4_60_ = extraout_var_01;
            __x = 3;
            dVar6 = gamma(auVar24._0_8_);
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_320),
                                     ZEXT416((uint)(SUB84(dVar6,0) * auVar24._0_4_)),
                                     ZEXT416((uint)((auVar1._0_4_ + auVar1._0_4_) * local_320)));
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)auVar24._0_4_),ZEXT416((uint)local_354),auVar1);
            fVar4 = auVar1._0_4_ * 3.0;
            fVar5 = local_30c;
            std::abs(__x);
            if (fVar4 * fVar5 < local_31c) {
              pstd::optional<pbrt::TriangleIntersection>::optional
                        (this_00,(TriangleIntersection *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
            }
            else {
              memset(in_RDI,0,0x14);
              pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
            }
          }
          else {
            memset(in_RDI,0,0x14);
            pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
          }
        }
        else {
          memset(in_RDI,0,0x14);
          pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
        }
      }
      else {
        memset(in_RDI,0,0x14);
        pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
      }
    }
    else {
      memset(in_RDI,0,0x14);
      pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
    }
  }
  else {
    memset(in_RDI,0,0x14);
    pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
  }
  return in_RDI;
}

Assistant:

pstd::optional<TriangleIntersection> IntersectTriangle(const Ray &ray, Float tMax,
                                                       const Point3f &p0,
                                                       const Point3f &p1,
                                                       const Point3f &p2) {
    // Return no intersection if triangle is degenerate
    if (LengthSquared(Cross(p2 - p0, p1 - p0)) == 0)
        return {};

    // Transform triangle vertices to ray coordinate space
    // Translate vertices based on ray origin
    Point3f p0t = p0 - Vector3f(ray.o);
    Point3f p1t = p1 - Vector3f(ray.o);
    Point3f p2t = p2 - Vector3f(ray.o);

    // Permute components of triangle vertices and ray direction
    int kz = MaxComponentIndex(Abs(ray.d));
    int kx = kz + 1;
    if (kx == 3)
        kx = 0;
    int ky = kx + 1;
    if (ky == 3)
        ky = 0;
    Vector3f d = Permute(ray.d, {kx, ky, kz});
    p0t = Permute(p0t, {kx, ky, kz});
    p1t = Permute(p1t, {kx, ky, kz});
    p2t = Permute(p2t, {kx, ky, kz});

    // Apply shear transformation to translated vertex positions
    Float Sx = -d.x / d.z;
    Float Sy = -d.y / d.z;
    Float Sz = 1.f / d.z;
    p0t.x += Sx * p0t.z;
    p0t.y += Sy * p0t.z;
    p1t.x += Sx * p1t.z;
    p1t.y += Sy * p1t.z;
    p2t.x += Sx * p2t.z;
    p2t.y += Sy * p2t.z;

    // Compute edge function coefficients _e0_, _e1_, and _e2_
    Float e0 = DifferenceOfProducts(p1t.x, p2t.y, p1t.y, p2t.x);
    Float e1 = DifferenceOfProducts(p2t.x, p0t.y, p2t.y, p0t.x);
    Float e2 = DifferenceOfProducts(p0t.x, p1t.y, p0t.y, p1t.x);

    // Fall back to double precision test at triangle edges
    if (sizeof(Float) == sizeof(float) && (e0 == 0.0f || e1 == 0.0f || e2 == 0.0f)) {
        double p2txp1ty = (double)p2t.x * (double)p1t.y;
        double p2typ1tx = (double)p2t.y * (double)p1t.x;
        e0 = (float)(p2typ1tx - p2txp1ty);
        double p0txp2ty = (double)p0t.x * (double)p2t.y;
        double p0typ2tx = (double)p0t.y * (double)p2t.x;
        e1 = (float)(p0typ2tx - p0txp2ty);
        double p1txp0ty = (double)p1t.x * (double)p0t.y;
        double p1typ0tx = (double)p1t.y * (double)p0t.x;
        e2 = (float)(p1typ0tx - p1txp0ty);
    }

    // Perform triangle edge and determinant tests
    if ((e0 < 0 || e1 < 0 || e2 < 0) && (e0 > 0 || e1 > 0 || e2 > 0))
        return {};
    Float det = e0 + e1 + e2;
    if (det == 0)
        return {};

    // Compute scaled hit distance to triangle and test against ray $t$ range
    p0t.z *= Sz;
    p1t.z *= Sz;
    p2t.z *= Sz;
    Float tScaled = e0 * p0t.z + e1 * p1t.z + e2 * p2t.z;
    if (det < 0 && (tScaled >= 0 || tScaled < tMax * det))
        return {};
    else if (det > 0 && (tScaled <= 0 || tScaled > tMax * det))
        return {};

    // Compute barycentric coordinates and $t$ value for triangle intersection
    Float invDet = 1 / det;
    Float b0 = e0 * invDet, b1 = e1 * invDet, b2 = e2 * invDet;
    Float t = tScaled * invDet;
    DCHECK(!IsNaN(t));

    // Ensure that computed triangle $t$ is conservatively greater than zero
    // Compute $\delta_z$ term for triangle $t$ error bounds
    Float maxZt = MaxComponentValue(Abs(Vector3f(p0t.z, p1t.z, p2t.z)));
    Float deltaZ = gamma(3) * maxZt;

    // Compute $\delta_x$ and $\delta_y$ terms for triangle $t$ error bounds
    Float maxXt = MaxComponentValue(Abs(Vector3f(p0t.x, p1t.x, p2t.x)));
    Float maxYt = MaxComponentValue(Abs(Vector3f(p0t.y, p1t.y, p2t.y)));
    Float deltaX = gamma(5) * (maxXt + maxZt);
    Float deltaY = gamma(5) * (maxYt + maxZt);

    // Compute $\delta_e$ term for triangle $t$ error bounds
    Float deltaE = 2 * (gamma(2) * maxXt * maxYt + deltaY * maxXt + deltaX * maxYt);

    // Compute $\delta_t$ term for triangle $t$ error bounds and check _t_
    Float maxE = MaxComponentValue(Abs(Vector3f(e0, e1, e2)));
    Float deltaT =
        3 * (gamma(3) * maxE * maxZt + deltaE * maxZt + deltaZ * maxE) * std::abs(invDet);
    if (t <= deltaT)
        return {};

    // Return _TriangleIntersection_ for intersection
    return TriangleIntersection{b0, b1, b2, t};
}